

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

GLFWbool waitForVisibilityNotify(_GLFWwindow *window)

{
  int iVar1;
  GLFWbool GVar2;
  double local_e0;
  double timeout;
  XEvent dummy;
  _GLFWwindow *window_local;
  
  local_e0 = 0.1;
  dummy.pad[0x17] = (long)window;
  do {
    iVar1 = (*_glfw.x11.xlib.CheckTypedWindowEvent)
                      (_glfw.x11.display,*(Window *)(dummy.pad[0x17] + 0x350),0xf,(XEvent *)&timeout
                      );
    if (iVar1 != 0) {
      return 1;
    }
    GVar2 = waitForEvent(&local_e0);
  } while (GVar2 != 0);
  return 0;
}

Assistant:

static GLFWbool waitForVisibilityNotify(_GLFWwindow* window)
{
    XEvent dummy;
    double timeout = 0.1;

    while (!XCheckTypedWindowEvent(_glfw.x11.display,
                                   window->x11.handle,
                                   VisibilityNotify,
                                   &dummy))
    {
        if (!waitForEvent(&timeout))
            return GLFW_FALSE;
    }

    return GLFW_TRUE;
}